

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O0

int __thiscall
vkt::pipeline::TestTexture3D::copy(TestTexture3D *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int width;
  int height;
  int depth;
  TestTexture3D *this_00;
  TestTexture *destTexture;
  DefaultDeleter<vkt::pipeline::TestTexture> local_35 [20];
  undefined1 local_21;
  EVP_PKEY_CTX *local_20;
  TestTexture3D *this_local;
  TextureFormat format_local;
  MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_> *texture;
  
  local_21 = 0;
  local_20 = dst;
  this_local = (TestTexture3D *)src;
  format_local = (TextureFormat)this;
  this_00 = (TestTexture3D *)operator_new(0x78);
  width = tcu::Texture3D::getWidth((Texture3D *)(dst + 0x20));
  height = tcu::Texture3D::getHeight((Texture3D *)(dst + 0x20));
  depth = tcu::Texture3D::getDepth((Texture3D *)(dst + 0x20));
  TestTexture3D(this_00,(TextureFormat *)&this_local,width,height,depth);
  de::DefaultDeleter<vkt::pipeline::TestTexture>::DefaultDeleter(local_35);
  de::details::MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
  ::MovePtr((MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_> *)
            this,this_00);
  destTexture = de::details::
                UniqueBase<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                ::operator*((UniqueBase<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                             *)this);
  TestTexture::copyToTexture((TestTexture *)dst,destTexture);
  return (int)this;
}

Assistant:

de::MovePtr<TestTexture> TestTexture3D::copy(const tcu::TextureFormat format) const
{
	DE_ASSERT(!isCompressed());

	de::MovePtr<TestTexture>	texture	(new TestTexture3D(format, m_texture.getWidth(), m_texture.getHeight(), m_texture.getDepth()));

	copyToTexture(*texture);

	return texture;
}